

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPo.c
# Opt level: O0

Vec_Wec_t * Acec_ParseSignature(char *p)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  Vec_Wec_t *vM2;
  Vec_Wec_t *pVVar4;
  Vec_Wec_t *pVVar5;
  size_t sVar6;
  char *pCopy;
  int Len;
  char *pStop3;
  char *p3;
  char *pStop2;
  char *p2;
  char *pStop;
  Vec_Wec_t *vRes;
  Vec_Wec_t *vTemp2;
  Vec_Wec_t *vTemp1;
  Vec_Wec_t *vAdd;
  char *p_local;
  
  if (*p == '(') {
    pcVar2 = strstr(p,")");
    if (pcVar2 == (char *)0x0) {
      p_local = (char *)0x0;
    }
    else {
      p_local = (char *)Acec_ParseSignatureOne(p,pcVar2);
      if (pcVar2[1] != '\0') {
        if (pcVar2[1] != '*') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecPo.c"
                        ,0x9b,"Vec_Wec_t *Acec_ParseSignature(char *)");
        }
        pcVar2 = pcVar2 + 2;
        pcVar3 = strstr(pcVar2,")");
        if (*pcVar2 == '(') {
          if (pcVar3 == (char *)0x0) {
            p_local = (char *)0x0;
          }
          else {
            vM2 = Acec_ParseSignatureOne(pcVar2,pcVar3);
            if (pcVar3[1] == '\0') {
              pVVar4 = Acec_ParseDistribute((Vec_Wec_t *)p_local,vM2,(Vec_Wec_t *)0x0);
              Vec_WecFree((Vec_Wec_t *)p_local);
              Vec_WecFree(vM2);
              p_local = (char *)pVVar4;
            }
            else {
              if (pcVar3[1] != '+') {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecPo.c"
                              ,0x99,"Vec_Wec_t *Acec_ParseSignature(char *)");
              }
              pcVar3 = pcVar3 + 2;
              pcVar2 = strstr(pcVar3,")");
              if (*pcVar3 == '(') {
                if (pcVar2 == (char *)0x0) {
                  p_local = (char *)0x0;
                }
                else {
                  pVVar4 = Acec_ParseSignatureOne(pcVar3,pcVar2);
                  pVVar5 = Acec_ParseDistribute((Vec_Wec_t *)p_local,vM2,pVVar4);
                  Vec_WecFree((Vec_Wec_t *)p_local);
                  Vec_WecFree(vM2);
                  Vec_WecFree(pVVar4);
                  p_local = (char *)pVVar5;
                }
              }
              else {
                p_local = (char *)0x0;
              }
            }
          }
        }
        else {
          p_local = (char *)0x0;
        }
      }
    }
  }
  else {
    sVar6 = strlen(p);
    iVar1 = (int)sVar6;
    pcVar2 = (char *)malloc((long)(iVar1 + 3));
    *pcVar2 = '(';
    strcpy(pcVar2 + 1,p);
    pcVar2[iVar1 + 1] = ')';
    pcVar2[iVar1 + 2] = '\0';
    p_local = (char *)Acec_ParseSignatureOne(pcVar2,pcVar2 + (long)iVar1 + 1);
    if (pcVar2 != (char *)0x0) {
      free(pcVar2);
    }
  }
  return (Vec_Wec_t *)p_local;
}

Assistant:

Vec_Wec_t * Acec_ParseSignature( char * p )
{
    Vec_Wec_t * vAdd = NULL, * vTemp1, * vTemp2, * vRes;
    if ( p[0] == '(' )
    {
        char * pStop = strstr(p, ")");
        if ( pStop == NULL )
            return NULL;
        vTemp1 = Acec_ParseSignatureOne( p, pStop );
        if ( pStop[1] == 0 )
            return vTemp1;
        if ( pStop[1] == '*' )
        {
            char * p2 = pStop + 2;
            char * pStop2 = strstr(p2, ")");
            if ( p2[0] != '(' )
                return NULL;
            if ( pStop2 == NULL )
                return NULL;
            vTemp2 = Acec_ParseSignatureOne( p2, pStop2 );
            if ( pStop2[1] == 0 )
            {
                vRes = Acec_ParseDistribute( vTemp1, vTemp2, vAdd );
                Vec_WecFree( vTemp1 );
                Vec_WecFree( vTemp2 );
                return vRes;
            }
            if ( pStop2[1] == '+' )
            {
                char * p3 = pStop2 + 2;
                char * pStop3 = strstr(p3, ")");
                if ( p3[0] != '(' )
                    return NULL;
                if ( pStop3 == NULL )
                    return NULL;
                vAdd = Acec_ParseSignatureOne( p3, pStop3 );
                vRes = Acec_ParseDistribute( vTemp1, vTemp2, vAdd );
                Vec_WecFree( vTemp1 );
                Vec_WecFree( vTemp2 );
                Vec_WecFree( vAdd );
                return vRes;
            }
            assert( 0 );
        }
        assert( 0 );
    }
    else
    {
        int Len = strlen(p);
        char * pCopy = ABC_ALLOC( char, Len+3 );
        pCopy[0] = '(';
        strcpy( pCopy+1, p );
        pCopy[Len+1] = ')';
        pCopy[Len+2] = '\0';
        vRes = Acec_ParseSignatureOne( pCopy, pCopy + Len + 1 );
        ABC_FREE( pCopy );
        return vRes;
    }
    return NULL;
}